

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O1

void __thiscall rw::AnimInterpolator::addTime(AnimInterpolator *this,float32 t)

{
  int iVar1;
  int iVar2;
  Animation *anim;
  bool bVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  AnimInterpolator *pAVar8;
  AnimInterpolator *pAVar9;
  undefined8 *puVar10;
  int iVar11;
  float fVar12;
  
  if (0.0 < (float)t) {
    fVar12 = (float)t + (float)this->currentTime;
    this->currentTime = (float32)fVar12;
    anim = this->currentAnim;
    if ((float)anim->duration <= fVar12 && fVar12 != (float)anim->duration) {
      setCurrentAnim(this,anim);
      return;
    }
    iVar11 = this->currentAnimKeyFrameSize;
    plVar4 = (long *)((long)anim->numFrames * (long)iVar11 + (long)anim->keyframes);
    if (this->nextFrame < plVar4) {
      plVar6 = (long *)this->nextFrame;
      iVar1 = this->numNodes;
      iVar2 = this->currentInterpKeyFrameSize;
      puVar10 = (undefined8 *)0x0;
      plVar7 = (long *)this->nextFrame;
      do {
        if (fVar12 < *(float *)(*plVar7 + 8)) break;
        if (0 < iVar1) {
          pAVar8 = this + 1;
          lVar5 = 1;
          do {
            pAVar9 = (AnimInterpolator *)((long)&pAVar8->currentAnim + (long)iVar2);
            if (*(long *)&pAVar8->currentTime == *plVar7) break;
            bVar3 = lVar5 < iVar1;
            pAVar8 = pAVar9;
            lVar5 = lVar5 + 1;
          } while (bVar3);
          puVar10 = (undefined8 *)((long)pAVar9 - (long)iVar2);
        }
        *puVar10 = puVar10[1];
        puVar10[1] = plVar7;
        plVar6 = (long *)((long)plVar6 + (long)iVar11);
        this->nextFrame = plVar6;
        plVar7 = plVar6;
      } while (plVar6 < plVar4);
    }
    if (0 < this->numNodes) {
      iVar11 = 0;
      do {
        lVar5 = (long)this->currentInterpKeyFrameSize * (long)iVar11;
        (*this->interpCB)((Animation **)((long)&this[1].currentAnim + lVar5),
                          *(Animation **)((long)&this[1].currentAnim + lVar5),
                          *(void **)((long)&this[1].currentTime + lVar5),this->currentTime,
                          this->currentAnim->customData);
        iVar11 = iVar11 + 1;
      } while (iVar11 < this->numNodes);
    }
  }
  return;
}

Assistant:

void
AnimInterpolator::addTime(float32 t)
{
	int32 i;
	if(t <= 0.0f)
		return;
	this->currentTime += t;
	// reset animation
	if(this->currentTime > this->currentAnim->duration){
		this->setCurrentAnim(this->currentAnim);
		return;
	}
	KeyFrameHeader *last = this->getAnimFrame(this->currentAnim->numFrames);
	KeyFrameHeader *next = (KeyFrameHeader*)this->nextFrame;
	InterpFrameHeader *ifrm = nil;
	while(next < last && next->prev->time <= this->currentTime){
		// find next interpolation frame to expire
		for(i = 0; i < this->numNodes; i++){
			ifrm = this->getInterpFrame(i);
			if(ifrm->keyFrame2 == next->prev)
				break;
		}
		// advance interpolation frame
		ifrm->keyFrame1 = ifrm->keyFrame2;
		ifrm->keyFrame2 = next;
		// ... and next frame
		next = (KeyFrameHeader*)((uint8*)this->nextFrame +
		                         currentAnimKeyFrameSize);
		this->nextFrame = next;
	}
	for(i = 0; i < this->numNodes; i++){
		ifrm = this->getInterpFrame(i);
		this->interpCB(ifrm, ifrm->keyFrame1, ifrm->keyFrame2,
		               this->currentTime,
		               this->currentAnim->customData);
	}
}